

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractNumericFacetValidator.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::AbstractNumericFacetValidator::serialize
          (AbstractNumericFacetValidator *this,XSerializeEngine *serEng)

{
  bool bVar1;
  NumberType local_1c;
  NumberType numType;
  int nType;
  XSerializeEngine *serEng_local;
  AbstractNumericFacetValidator *this_local;
  
  _numType = serEng;
  serEng_local = (XSerializeEngine *)this;
  bVar1 = XSerializeEngine::isStoring(serEng);
  if (bVar1) {
    DatatypeValidator::serialize(&this->super_DatatypeValidator,_numType);
    storeClusive(this,_numType,(bool)(this->fMaxInclusiveInherited & 1),this->fMaxInclusive);
    storeClusive(this,_numType,(bool)(this->fMaxExclusiveInherited & 1),this->fMaxExclusive);
    storeClusive(this,_numType,(bool)(this->fMinInclusiveInherited & 1),this->fMinInclusive);
    storeClusive(this,_numType,(bool)(this->fMinExclusiveInherited & 1),this->fMinExclusive);
    XSerializeEngine::operator<<(_numType,(bool)(this->fEnumerationInherited & 1));
    XTemplateSerializer::storeObject(this->fStrEnumeration,_numType);
    XTemplateSerializer::storeObject(this->fEnumeration,_numType);
  }
  else {
    XSerializeEngine::operator>>(_numType,(int *)&local_1c);
    DatatypeValidator::serialize(&this->super_DatatypeValidator,_numType);
    loadClusive(this,_numType,&this->fMaxInclusiveInherited,&this->fMaxInclusive,local_1c,1);
    loadClusive(this,_numType,&this->fMaxExclusiveInherited,&this->fMaxExclusive,local_1c,2);
    loadClusive(this,_numType,&this->fMinInclusiveInherited,&this->fMinInclusive,local_1c,3);
    loadClusive(this,_numType,&this->fMinExclusiveInherited,&this->fMinExclusive,local_1c,4);
    XSerializeEngine::operator>>(_numType,&this->fEnumerationInherited);
    XTemplateSerializer::loadObject(&this->fStrEnumeration,8,true,_numType);
    XTemplateSerializer::loadObject(&this->fEnumeration,8,true,local_1c,_numType);
  }
  return;
}

Assistant:

void AbstractNumericFacetValidator::serialize(XSerializeEngine& serEng)
{

    if (serEng.isStoring())
    {

        /***
         * don't move this line out of the if statement,
         * it is done purposely to allow AbstractNumericFacetValidator
         * read the number type information before DatatypeValidator
         * during loading
         ***/
        DatatypeValidator::serialize(serEng);

        // need not write type info for the XMLNumber since
        // the derivative class has done that       
        storeClusive(serEng, fMaxInclusiveInherited, fMaxInclusive);
        storeClusive(serEng, fMaxExclusiveInherited, fMaxExclusive);
        storeClusive(serEng, fMinInclusiveInherited, fMinInclusive);
        storeClusive(serEng, fMinExclusiveInherited, fMinExclusive);

        serEng<<fEnumerationInherited;

        /***
         * Serialize RefArrayVectorOf<XMLCh>
         * Serialize RefVectorOf<XMLNumber>
         ***/
        XTemplateSerializer::storeObject(fStrEnumeration, serEng);
        XTemplateSerializer::storeObject(fEnumeration, serEng);
   
    }
    else
    {
        // Read the number type info for the XMLNumber FIRST!!!
        int                     nType;
        XMLNumber::NumberType   numType;
        serEng>>nType;
        numType = (XMLNumber::NumberType) nType;

        DatatypeValidator::serialize(serEng);

        loadClusive(serEng, fMaxInclusiveInherited, fMaxInclusive, numType, 1);
        loadClusive(serEng, fMaxExclusiveInherited, fMaxExclusive, numType, 2);
        loadClusive(serEng, fMinInclusiveInherited, fMinInclusive, numType, 3);
        loadClusive(serEng, fMinExclusiveInherited, fMinExclusive, numType, 4);

        serEng>>fEnumerationInherited;

        /***
         *  Deserialize RefArrayVectorOf<XMLCh>         
         *  Deserialize RefVectorOf<XMLNumber>   
         ***/
        XTemplateSerializer::loadObject(&fStrEnumeration, 8, true, serEng);
        XTemplateSerializer::loadObject(&fEnumeration, 8, true, numType, serEng);

    }

}